

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.hpp
# Opt level: O2

ArgOption<unsigned_int> * __thiscall
Utils::ArgumentParser::make_option<unsigned_int>
          (ArgumentParser *this,string *name,string *description,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *opts)

{
  pointer pbVar1;
  iterator iVar2;
  ArgOption<unsigned_int> *this_00;
  pointer pbVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgOption<unsigned_int>_*>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> i;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->used_name)._M_t._M_impl.super__Rb_tree_header) {
    __assert_fail("used_name.find(name) == used_name.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/include/ArgumentParser.hpp"
                  ,0x105,
                  "ArgOption<T> &Utils::ArgumentParser::make_option(const std::string &, const std::string &, const std::vector<std::string> &) [T = unsigned int]"
                 );
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this,name);
  this_00 = (ArgOption<unsigned_int> *)operator_new(0x68);
  ArgOption<unsigned_int>::ArgOption(this_00,name,description,opts);
  local_78.first._M_dataplus._M_p = (pointer)this_00;
  std::vector<Utils::ValueArgObj*,std::allocator<Utils::ValueArgObj*>>::
  emplace_back<Utils::ValueArgObj*>
            ((vector<Utils::ValueArgObj*,std::allocator<Utils::ValueArgObj*>> *)&this->options,
             (ValueArgObj **)&local_78);
  pbVar3 = (opts->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (opts->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pbVar3 == pbVar1) {
      return this_00;
    }
    std::__cxx11::string::string((string *)&i,(string *)pbVar3);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->used_identifier)._M_t,&i);
    if ((_Rb_tree_header *)iVar2._M_node !=
        &(this->used_identifier)._M_t._M_impl.super__Rb_tree_header) break;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->used_identifier,&i);
    std::__cxx11::string::string((string *)&local_78,(string *)&i);
    local_78.second = this_00;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Utils::ValueArgObj*>,std::_Select1st<std::pair<std::__cxx11::string_const,Utils::ValueArgObj*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Utils::ValueArgObj*>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,Utils::ArgOption<unsigned_int>*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Utils::ValueArgObj*>,std::_Select1st<std::pair<std::__cxx11::string_const,Utils::ValueArgObj*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Utils::ValueArgObj*>>>
                *)&this->option_mapping,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&i);
    pbVar3 = pbVar3 + 1;
  }
  __assert_fail("used_identifier.find(i) == used_identifier.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/include/ArgumentParser.hpp"
                ,0x10c,
                "ArgOption<T> &Utils::ArgumentParser::make_option(const std::string &, const std::string &, const std::vector<std::string> &) [T = unsigned int]"
               );
}

Assistant:

ArgOption<T>& ArgumentParser::make_option( const std::string& name,
        const std::string& description, const std::vector<std::string>& opts) {
    assert(used_name.find(name) == used_name.end());
    used_name.insert(name);

    auto o = new ArgOption<T>(name,description,opts);
    options.push_back(o);

    for ( auto i : opts ) {
        assert(used_identifier.find(i) == used_identifier.end());
        used_identifier.insert(i);

        option_mapping.insert( make_pair (i, o));
    }

    return *o;
}